

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampling.h
# Opt level: O2

Point2f __thiscall pbrt::detail::Hammersley2DIter::operator*(Hammersley2DIter *this)

{
  int iVar1;
  undefined1 auVar2 [16];
  undefined1 in_ZMM0 [64];
  undefined1 auVar3 [64];
  undefined1 extraout_var [60];
  
  iVar1 = (this->super_IndexingIterator<pbrt::detail::Hammersley2DIter>).i;
  auVar2._4_12_ = in_ZMM0._4_12_;
  auVar2._0_4_ = (float)iVar1 /
                 (float)(this->super_IndexingIterator<pbrt::detail::Hammersley2DIter>).n;
  auVar3._0_4_ = RadicalInverse(0,(long)iVar1);
  auVar3._4_60_ = extraout_var;
  auVar2 = vinsertps_avx(auVar2,auVar3._0_16_,0x10);
  return (Point2f)auVar2._0_8_;
}

Assistant:

PBRT_CPU_GPU
    Point2f operator*() { return {Float(i) / Float(n), RadicalInverse(0, i)}; }